

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__cleanup_gathered_coefficients
               (stbir_edge edge,stbir__filter_extent_info *filter_info,stbir__scale_info *scale_info
               ,int num_contributors,stbir__contributors *contributors,float *coefficient_group,
               int coefficient_width)

{
  float fVar1;
  int iVar2;
  stbir_uint32 sVar3;
  stbir_uint32 sVar4;
  uint uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  stbir_uint32 sVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  stbir_uint32 sVar18;
  long lVar19;
  stbir__contributors *psVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  int local_6c;
  int local_68;
  int local_64;
  
  iVar2 = scale_info->input_full_size;
  iVar7 = iVar2 + -1;
  sVar3 = scale_info->scale_numerator;
  sVar4 = scale_info->scale_denominator;
  bVar22 = scale_info->scale_is_rational != 0;
  iVar10 = num_contributors - sVar3;
  sVar12 = num_contributors;
  if ((iVar10 != 0 && (int)sVar3 <= num_contributors) && bVar22) {
    sVar12 = sVar3;
  }
  sVar18 = 0;
  if ((int)sVar12 < 1) {
    sVar12 = 0;
  }
  lVar19 = (long)coefficient_width;
  pfVar11 = coefficient_group;
  psVar20 = contributors;
  for (; sVar18 != sVar12; sVar18 = sVar18 + 1) {
    lVar21 = (long)psVar20->n1 - (long)psVar20->n0;
    dVar23 = 0.0;
    for (lVar14 = 0; lVar14 <= lVar21; lVar14 = lVar14 + 1) {
      if (2.0 < ABS(pfVar11[lVar14])) {
        __assert_fail("( coeffs[i] >= -2.0f ) && ( coeffs[i] <= 2.0f )",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                      ,0xda7,
                      "void stbir__cleanup_gathered_coefficients(stbir_edge, stbir__filter_extent_info *, stbir__scale_info *, int, stbir__contributors *, float *, int)"
                     );
      }
      dVar23 = dVar23 + (double)pfVar11[lVar14];
    }
    if (7.52316384526264e-37 <= ABS(dVar23)) {
      if (dVar23 != 1.0) {
        for (lVar14 = 0; lVar14 <= lVar21; lVar14 = lVar14 + 1) {
          pfVar11[lVar14] = (float)((double)pfVar11[lVar14] * (1.0 / dVar23));
        }
      }
    }
    else {
      psVar20->n1 = psVar20->n0;
      *pfVar11 = 0.0;
    }
    psVar20 = psVar20 + 1;
    pfVar11 = pfVar11 + lVar19;
  }
  if ((iVar10 != 0 && (int)sVar3 <= num_contributors) && bVar22) {
    piVar17 = &contributors->n1;
    for (sVar12 = sVar3; (int)sVar12 < num_contributors; sVar12 = sVar12 + 1) {
      piVar17[(long)(int)sVar3 * 2 + -1] = ((stbir__contributors *)(piVar17 + -1))->n0 + sVar4;
      piVar17[(long)(int)sVar3 * 2] = *piVar17 + sVar4;
      piVar17 = piVar17 + 2;
    }
    iVar8 = sVar3 * coefficient_width;
    pfVar11 = coefficient_group;
    if (3 < iVar8) {
      uVar15 = (long)(iVar10 * coefficient_width) * 4;
      uVar16 = uVar15 & 0xfffffffffffffff0;
      do {
        uVar6 = *(undefined8 *)(pfVar11 + 2);
        *(undefined8 *)(pfVar11 + iVar8) = *(undefined8 *)pfVar11;
        *(undefined8 *)(pfVar11 + iVar8 + 2) = uVar6;
        pfVar11 = pfVar11 + 4;
        uVar15 = uVar15 - 0x10;
      } while (pfVar11 < (float *)(uVar16 + (long)coefficient_group));
      if (uVar15 == 0) goto LAB_0019482a;
    }
    do {
      pfVar11[iVar8] = *pfVar11;
      pfVar11 = pfVar11 + 1;
    } while (pfVar11 < coefficient_group + iVar10 * coefficient_width);
  }
LAB_0019482a:
  iVar10 = 0;
  if (num_contributors < 1) {
    num_contributors = iVar10;
  }
  local_68 = 0x7fffffff;
  local_64 = -0x7fffffff;
  local_6c = -1;
  do {
    if (iVar10 == num_contributors) {
      filter_info->lowest = local_68;
      filter_info->highest = local_64;
      filter_info->widest = local_6c;
      return;
    }
    if (edge == STBIR_EDGE_ZERO) {
      iVar8 = contributors->n1;
      if (iVar2 <= contributors->n1) {
        contributors->n1 = iVar7;
        iVar8 = iVar7;
      }
      iVar9 = contributors->n0;
      if ((iVar9 < 0) && (contributors->n0 = 0, -1 < iVar8)) {
        for (uVar15 = 0; iVar8 + 1 != uVar15; uVar15 = uVar15 + 1) {
          coefficient_group[uVar15] = coefficient_group[(int)uVar15 - iVar9];
        }
      }
    }
    else if (edge < STBIR_EDGE_WRAP) {
      iVar8 = contributors->n1;
      uVar5 = contributors->n0;
      if (iVar2 <= iVar8) {
        contributors->n1 = iVar7;
        for (lVar14 = (long)iVar2; lVar14 <= iVar8; lVar14 = lVar14 + 1) {
          iVar9 = (*stbir__edge_wrap_slow[edge])((int)lVar14,iVar2);
          stbir__insert_coeff(contributors,coefficient_group,iVar9,
                              coefficient_group[lVar14 - (int)uVar5],coefficient_width);
        }
        uVar5 = contributors->n0;
      }
      if ((int)uVar5 < 0) {
        pfVar11 = coefficient_group + ~uVar5;
        iVar8 = -1;
        while ((int)uVar5 < iVar8) {
          iVar9 = (*stbir__edge_wrap_slow[edge])(iVar8,iVar2);
          fVar1 = *pfVar11;
          pfVar11 = pfVar11 + -1;
          stbir__insert_coeff(contributors,coefficient_group,iVar9,fVar1,coefficient_width);
          iVar8 = iVar8 + -1;
          uVar5 = contributors->n0;
        }
        fVar1 = *pfVar11;
        contributors->n0 = 0;
        for (lVar14 = 0; lVar14 <= contributors->n1; lVar14 = lVar14 + 1) {
          coefficient_group[lVar14] = coefficient_group[lVar14 - (int)uVar5];
        }
        iVar8 = (*stbir__edge_wrap_slow[edge])(uVar5,iVar2);
        stbir__insert_coeff(contributors,coefficient_group,iVar8,fVar1,coefficient_width);
      }
    }
    iVar8 = contributors->n0;
    iVar9 = contributors->n1 - iVar8;
    if (iVar8 <= contributors->n1) {
      lVar14 = (long)(iVar9 + 1);
      iVar9 = iVar9 + 2;
      while (lVar14 = lVar14 + -1, lVar14 != -1) {
        iVar9 = iVar9 + -1;
        if ((coefficient_group[lVar14] != 0.0) || (NAN(coefficient_group[lVar14])))
        goto LAB_00194a40;
      }
      iVar9 = 0;
LAB_00194a40:
      iVar13 = iVar8 + iVar9 + -1;
      contributors->n1 = iVar13;
      if (0 < iVar9) {
        if (iVar8 < local_68) {
          local_68 = iVar8;
        }
        if (local_64 < iVar13) {
          local_64 = iVar13;
        }
        if (local_6c < iVar9) {
          local_6c = iVar9;
        }
      }
      for (lVar14 = (long)iVar9; lVar14 < lVar19; lVar14 = lVar14 + 1) {
        coefficient_group[lVar14] = 0.0;
      }
    }
    contributors = contributors + 1;
    coefficient_group = coefficient_group + lVar19;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

static void stbir__cleanup_gathered_coefficients( stbir_edge edge, stbir__filter_extent_info* filter_info, stbir__scale_info * scale_info, int num_contributors, stbir__contributors* contributors, float * coefficient_group, int coefficient_width )
{
  int input_size = scale_info->input_full_size;
  int input_last_n1 = input_size - 1;
  int n, end;
  int lowest = 0x7fffffff;
  int highest = -0x7fffffff;
  int widest = -1;
  int numerator = scale_info->scale_numerator;
  int denominator = scale_info->scale_denominator;
  int polyphase = ( ( scale_info->scale_is_rational ) && ( numerator < num_contributors ) );
  float * coeffs;
  stbir__contributors * contribs;

  // weight all the coeffs for each sample
  coeffs = coefficient_group;
  contribs = contributors;
  end = num_contributors; if ( polyphase ) end = numerator;
  for (n = 0; n < end; n++)
  {
    int i;
    STBIR_RENORM_TYPE filter_scale, total_filter = 0;
    int e;

    // add all contribs
    e = contribs->n1 - contribs->n0;
    for( i = 0 ; i <= e ; i++ )
    {
      total_filter += (STBIR_RENORM_TYPE) coeffs[i];
      STBIR_ASSERT( ( coeffs[i] >= -2.0f ) && ( coeffs[i] <= 2.0f )  ); // check for wonky weights
    }

    // rescale
    if ( ( total_filter < stbir__small_float ) && ( total_filter > -stbir__small_float ) )
    {
      // all coeffs are extremely small, just zero it
      contribs->n1 = contribs->n0;
      coeffs[0] = 0.0f;
    }
    else
    {
      // if the total isn't 1.0, rescale everything
      if ( ( total_filter < (1.0f-stbir__small_float) ) || ( total_filter > (1.0f+stbir__small_float) ) )
      {
        filter_scale = ((STBIR_RENORM_TYPE)1.0) / total_filter;

        // scale them all
        for (i = 0; i <= e; i++)
          coeffs[i] = (float) ( coeffs[i] * filter_scale );
      }
    }
    ++contribs;
    coeffs += coefficient_width;
  }

  // if we have a rational for the scale, we can exploit the polyphaseness to not calculate
  //   most of the coefficients, so we copy them here
  if ( polyphase )
  {
    stbir__contributors * prev_contribs = contributors;
    stbir__contributors * cur_contribs = contributors + numerator;

    for( n = numerator ; n < num_contributors ; n++ )
    {
      cur_contribs->n0 = prev_contribs->n0 + denominator;
      cur_contribs->n1 = prev_contribs->n1 + denominator;
      ++cur_contribs;
      ++prev_contribs;
    }
    stbir_overlapping_memcpy( coefficient_group + numerator * coefficient_width, coefficient_group, ( num_contributors - numerator ) * coefficient_width * sizeof( coeffs[ 0 ] ) );
  }

  coeffs = coefficient_group;
  contribs = contributors;

  for (n = 0; n < num_contributors; n++)
  {
    int i;

    // in zero edge mode, just remove out of bounds contribs completely (since their weights are accounted for now)
    if ( edge == STBIR_EDGE_ZERO )
    {
      // shrink the right side if necessary
      if ( contribs->n1 > input_last_n1 )
        contribs->n1 = input_last_n1;

      // shrink the left side
      if ( contribs->n0 < 0 )
      {
        int j, left, skips = 0;

        skips = -contribs->n0;
        contribs->n0 = 0;

        // now move down the weights
        left = contribs->n1 - contribs->n0 + 1;
        if ( left > 0 )
        {
          for( j = 0 ; j < left ; j++ )
            coeffs[ j ] = coeffs[ j + skips ];
        }
      }
    }
    else if ( ( edge == STBIR_EDGE_CLAMP ) || ( edge == STBIR_EDGE_REFLECT ) )
    {
      // for clamp and reflect, calculate the true inbounds position (based on edge type) and just add that to the existing weight

      // right hand side first
      if ( contribs->n1 > input_last_n1 )
      {
        int start = contribs->n0;
        int endi = contribs->n1;
        contribs->n1 = input_last_n1;
        for( i = input_size; i <= endi; i++ )
          stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( i, input_size ), coeffs[i-start], coefficient_width );
      }

      // now check left hand edge
      if ( contribs->n0 < 0 )
      {
        int save_n0;
        float save_n0_coeff;
        float * c = coeffs - ( contribs->n0 + 1 );

        // reinsert the coeffs with it reflected or clamped (insert accumulates, if the coeffs exist)
        for( i = -1 ; i > contribs->n0 ; i-- )
          stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( i, input_size ), *c--, coefficient_width );
        save_n0 = contribs->n0;
        save_n0_coeff = c[0]; // save it, since we didn't do the final one (i==n0), because there might be too many coeffs to hold (before we resize)!

        // now slide all the coeffs down (since we have accumulated them in the positive contribs) and reset the first contrib
        contribs->n0 = 0;
        for(i = 0 ; i <= contribs->n1 ; i++ )
          coeffs[i] = coeffs[i-save_n0];

        // now that we have shrunk down the contribs, we insert the first one safely
        stbir__insert_coeff( contribs, coeffs, stbir__edge_wrap_slow[edge]( save_n0, input_size ), save_n0_coeff, coefficient_width );
      }
    }

    if ( contribs->n0 <= contribs->n1 )
    {
      int diff = contribs->n1 - contribs->n0 + 1;
      while ( diff && ( coeffs[ diff-1 ] == 0.0f ) )
        --diff;

      contribs->n1 = contribs->n0 + diff - 1;

      if ( contribs->n0 <= contribs->n1 )
      {
        if ( contribs->n0 < lowest )
          lowest = contribs->n0;
        if ( contribs->n1 > highest )
          highest = contribs->n1;
        if ( diff > widest )
          widest = diff;
      }

      // re-zero out unused coefficients (if any)
      for( i = diff ; i < coefficient_width ; i++ )
        coeffs[i] = 0.0f;
    }

    ++contribs;
    coeffs += coefficient_width;
  }
  filter_info->lowest = lowest;
  filter_info->highest = highest;
  filter_info->widest = widest;
}